

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O2

void __thiscall UnitTest_lex7::Run(UnitTest_lex7 *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  allocator local_181;
  string local_180;
  LexerWrapper lexer;
  
  std::__cxx11::string::string((string *)&local_180,"_ __ ___ _1 _a _a1 a1 a_ a_1 name",&local_181);
  anon_unknown.dwarf_3b64::LexerWrapper::LexerWrapper(&lexer,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  iVar2 = 10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = anon_unknown.dwarf_3b64::LexerWrapper::GetToken(&lexer);
    if (iVar1 != 0x115) {
      std::__cxx11::string::string
                ((string *)&local_180,"\'lexer.GetToken() == luna::Token_Id\'",&local_181);
      UnitTestBase::Error(&this->super_UnitTestBase,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
    }
  }
  iVar2 = anon_unknown.dwarf_3b64::LexerWrapper::GetToken(&lexer);
  if (iVar2 != 0x11e) {
    std::__cxx11::string::string
              ((string *)&local_180,"\'lexer.GetToken() == luna::Token_EOF\'",&local_181);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
  }
  anon_unknown.dwarf_3b64::LexerWrapper::~LexerWrapper(&lexer);
  return;
}

Assistant:

TEST_CASE(lex7)
{
    LexerWrapper lexer("_ __ ___ _1 _a _a1 a1 a_ a_1 name");
    for (int i = 0; i < 10; ++i)
        EXPECT_TRUE(lexer.GetToken() == luna::Token_Id);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}